

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_4x64_impl.h
# Opt level: O3

void secp256k1_scalar_inverse(secp256k1_scalar *r,secp256k1_scalar *x)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  undefined4 extraout_EAX;
  int iVar4;
  ulong uVar5;
  uint64_t uVar6;
  undefined4 uVar7;
  int iVar8;
  uint64_t uVar9;
  int iVar10;
  secp256k1_modinv64_signed62 *x_00;
  ulong uVar11;
  secp256k1_scalar *r_00;
  ulong uVar12;
  uint64_t uVar13;
  ulong uVar14;
  ulong uVar15;
  bool bVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  secp256k1_modinv64_signed62 s;
  int local_68;
  int iStack_64;
  int iStack_60;
  int iStack_5c;
  secp256k1_modinv64_signed62 local_58;
  
  secp256k1_scalar_verify(x);
  uVar5 = x->d[2] | x->d[0];
  uVar11 = x->d[3] | x->d[1];
  secp256k1_scalar_verify(x);
  uVar1 = x->d[0];
  uVar2 = x->d[1];
  uVar12 = x->d[2];
  uVar3 = x->d[3];
  secp256k1_scalar_verify(x);
  uVar7 = 0xffffffff;
  uVar15 = uVar1 & 0x3fffffffffffffff;
  x_00 = &local_58;
  local_58.v[1] = (uVar2 & 0xfffffffffffffff) << 2 | uVar1 >> 0x3e;
  local_58.v[2] = (uVar12 & 0x3ffffffffffffff) << 4 | uVar2 >> 0x3c;
  local_58.v[3] = (uVar3 & 0xffffffffffffff) << 6 | uVar12 >> 0x3a;
  local_58.v[4] = uVar3 >> 0x38;
  local_58.v[0] = uVar15;
  secp256k1_modinv64(x_00,&secp256k1_const_modinfo_scalar);
  secp256k1_scalar_from_signed62(r,x_00);
  iVar10 = (int)x_00;
  secp256k1_scalar_verify(r);
  r_00 = r;
  secp256k1_scalar_verify(r);
  auVar18._0_4_ = -(uint)((int)r->d[2] == 0 && (int)r->d[0] == 0);
  auVar18._4_4_ = -(uint)(*(int *)((long)r->d + 0x14) == 0 && *(int *)((long)r->d + 4) == 0);
  auVar18._8_4_ = -(uint)((int)r->d[3] == 0 && (int)r->d[1] == 0);
  auVar18._12_4_ = -(uint)(*(int *)((long)r->d + 0x1c) == 0 && *(int *)((long)r->d + 0xc) == 0);
  iVar4 = movmskps(extraout_EAX,auVar18);
  local_68 = (int)uVar5;
  iStack_64 = (int)(uVar5 >> 0x20);
  iStack_60 = (int)uVar11;
  iStack_5c = (int)(uVar11 >> 0x20);
  auVar19._0_4_ = -(uint)(local_68 == 0);
  auVar19._4_4_ = -(uint)(iStack_64 == 0);
  auVar19._8_4_ = -(uint)(iStack_60 == 0);
  auVar19._12_4_ = -(uint)(iStack_5c == 0);
  iVar8 = movmskps(uVar7,auVar19);
  if ((iVar8 != 0xf) == (iVar4 == 0xf)) {
    secp256k1_scalar_inverse_cold_1();
    secp256k1_scalar_verify(r_00);
    auVar17._0_4_ = -(uint)((int)r_00->d[2] == 0 && (int)r_00->d[0] == 0);
    auVar17._4_4_ = -(uint)(*(int *)((long)r_00->d + 0x14) == 0 && *(int *)((long)r_00->d + 4) == 0)
    ;
    auVar17._8_4_ = -(uint)((int)r_00->d[3] == 0 && (int)r_00->d[1] == 0);
    auVar17._12_4_ =
         -(uint)(*(int *)((long)r_00->d + 0x1c) == 0 && *(int *)((long)r_00->d + 0xc) == 0);
    iVar4 = movmskps((int)uVar15,auVar17);
    secp256k1_scalar_verify(r_00);
    uVar9 = 0;
    uVar5 = -(long)iVar10;
    uVar11 = r_00->d[0] ^ uVar5;
    uVar12 = r_00->d[1] ^ uVar5;
    uVar14 = r_00->d[2] ^ uVar5;
    uVar1 = r_00->d[3];
    uVar2 = (ulong)CARRY8(uVar5 & 0xbfd25e8cd0364142,uVar11);
    uVar3 = (uVar5 & 0xbaaedce6af48a03b) + uVar12;
    uVar12 = (ulong)(CARRY8(uVar5 & 0xbaaedce6af48a03b,uVar12) || CARRY8(uVar3,uVar2));
    uVar15 = (uVar5 & 0xfffffffffffffffe) + uVar14;
    bVar16 = iVar4 == 0xf;
    uVar13 = uVar3 + uVar2;
    uVar6 = (uVar5 & 0xbfd25e8cd0364142) + uVar11;
    if (bVar16) {
      uVar13 = uVar9;
      uVar6 = uVar9;
    }
    r_00->d[0] = uVar6;
    r_00->d[1] = uVar13;
    uVar6 = uVar15 + uVar12;
    if (bVar16) {
      uVar6 = uVar9;
    }
    r_00->d[2] = uVar6;
    uVar6 = ((uVar5 ^ uVar1) - (long)iVar10) +
            (ulong)(CARRY8(uVar5 & 0xfffffffffffffffe,uVar14) || CARRY8(uVar15,uVar12));
    if (bVar16) {
      uVar6 = uVar9;
    }
    r_00->d[3] = uVar6;
    secp256k1_scalar_verify(r_00);
    return;
  }
  return;
}

Assistant:

static void secp256k1_scalar_inverse(secp256k1_scalar *r, const secp256k1_scalar *x) {
    secp256k1_modinv64_signed62 s;
#ifdef VERIFY
    int zero_in = secp256k1_scalar_is_zero(x);
#endif
    SECP256K1_SCALAR_VERIFY(x);

    secp256k1_scalar_to_signed62(&s, x);
    secp256k1_modinv64(&s, &secp256k1_const_modinfo_scalar);
    secp256k1_scalar_from_signed62(r, &s);

    SECP256K1_SCALAR_VERIFY(r);
    VERIFY_CHECK(secp256k1_scalar_is_zero(r) == zero_in);
}